

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.hpp
# Opt level: O0

void __thiscall spirv_cross::CompilerCPP::CompilerCPP(CompilerCPP *this,ParsedIR *ir_)

{
  ParsedIR *ir__local;
  CompilerCPP *this_local;
  
  CompilerGLSL::CompilerGLSL(&this->super_CompilerGLSL,ir_);
  (this->super_CompilerGLSL).super_Compiler._vptr_Compiler =
       (_func_int **)&PTR__CompilerCPP_005be908;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector(&this->resource_registrations);
  ::std::__cxx11::string::string((string *)&this->impl_type);
  ::std::__cxx11::string::string((string *)&this->resource_type);
  this->shared_counter = 0;
  ::std::__cxx11::string::string((string *)&this->interface_name);
  return;
}

Assistant:

explicit CompilerCPP(const ParsedIR &ir_)
	    : CompilerGLSL(ir_)
	{
	}